

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O3

int mem_read(int hdl,void *buffer,long nbytes)

{
  int iVar1;
  
  iVar1 = 0x6b;
  if (memTable[hdl].currentpos + nbytes <= memTable[hdl].fitsfilesize) {
    memcpy(buffer,*memTable[hdl].memaddrptr + memTable[hdl].currentpos,nbytes);
    memTable[hdl].currentpos = memTable[hdl].currentpos + nbytes;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mem_read(int hdl, void *buffer, long nbytes)
/*
  read bytes from the current position in the file
*/
{
    if (memTable[hdl].currentpos + nbytes > memTable[hdl].fitsfilesize)
        return(END_OF_FILE);

    memcpy(buffer,
           *(memTable[hdl].memaddrptr) + memTable[hdl].currentpos,
           nbytes);

    memTable[hdl].currentpos += nbytes;
    return(0);
}